

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O3

void __thiscall basist::selector::init_flags(selector *this)

{
  uint32_t i;
  long lVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  uint8_t uVar5;
  uint uVar6;
  ulong uVar7;
  uint32_t hist [4];
  int local_18 [6];
  
  local_18[0] = 0;
  local_18[1] = 0;
  local_18[2] = 0;
  local_18[3] = 0;
  lVar1 = 0;
  do {
    bVar3 = 0;
    uVar6 = 0;
    do {
      if (3 < (uVar6 | (uint)lVar1)) {
        __assert_fail("(x < 4) && (y < 4)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder_internal.h"
                      ,0x2f6,"uint32_t basist::selector::get_selector(uint32_t, uint32_t) const");
      }
      local_18[this->m_selectors[lVar1] >> (bVar3 & 0x1f) & 3] =
           local_18[this->m_selectors[lVar1] >> (bVar3 & 0x1f) & 3] + 1;
      uVar6 = uVar6 + 1;
      bVar3 = bVar3 + 2;
    } while (uVar6 != 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  this->m_lo_selector = '\x03';
  this->m_hi_selector = '\0';
  this->m_num_unique_selectors = '\0';
  uVar4 = 3;
  uVar2 = 0;
  uVar5 = '\0';
  uVar7 = 0;
  do {
    if (local_18[uVar2] != 0) {
      uVar5 = uVar5 + '\x01';
      this->m_num_unique_selectors = uVar5;
      if (uVar2 < (uVar4 & 0xff)) {
        this->m_lo_selector = (uint8_t)uVar2;
        uVar4 = uVar2 & 0xffffffff;
      }
      if ((uVar7 & 0xff) < uVar2) {
        this->m_hi_selector = (uint8_t)uVar2;
        uVar7 = uVar2 & 0xffffffff;
      }
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 4);
  return;
}

Assistant:

void init_flags()
		{
			uint32_t hist[4] = { 0, 0, 0, 0 };
			for (uint32_t y = 0; y < 4; y++)
			{
				for (uint32_t x = 0; x < 4; x++)
				{
					uint32_t s = get_selector(x, y);
					hist[s]++;
				}
			}

			m_lo_selector = 3;
			m_hi_selector = 0;
			m_num_unique_selectors = 0;

			for (uint32_t i = 0; i < 4; i++)
			{
				if (hist[i])
				{
					m_num_unique_selectors++;
					if (i < m_lo_selector) m_lo_selector = static_cast<uint8_t>(i);
					if (i > m_hi_selector) m_hi_selector = static_cast<uint8_t>(i);
				}
			}
		}